

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_strip.c
# Opt level: O0

uint64_t TIFFRasterScanlineSize64(TIFF *tif)

{
  uint64_t uVar1;
  uint64_t local_40;
  TIFF *local_30;
  uint64_t scanline;
  TIFFDirectory *td;
  TIFF *tif_local;
  
  local_40 = _TIFFMultiply64(tif,(ulong)(tif->tif_dir).td_bitspersample,
                             (ulong)(tif->tif_dir).td_imagewidth,"TIFFRasterScanlineSize64");
  if ((tif->tif_dir).td_planarconfig == 1) {
    uVar1 = _TIFFMultiply64(tif,local_40,(ulong)(tif->tif_dir).td_samplesperpixel,
                            "TIFFRasterScanlineSize64");
    if ((uVar1 & 7) == 0) {
      local_30 = (TIFF *)(uVar1 >> 3);
    }
    else {
      local_30 = (TIFF *)((uVar1 >> 3) + 1);
    }
    tif_local = local_30;
  }
  else {
    if ((local_40 & 7) == 0) {
      local_40 = local_40 >> 3;
    }
    else {
      local_40 = (local_40 >> 3) + 1;
    }
    tif_local = (TIFF *)_TIFFMultiply64(tif,local_40,(ulong)(tif->tif_dir).td_samplesperpixel,
                                        "TIFFRasterScanlineSize64");
  }
  return (uint64_t)tif_local;
}

Assistant:

uint64_t TIFFRasterScanlineSize64(TIFF *tif)
{
    static const char module[] = "TIFFRasterScanlineSize64";
    TIFFDirectory *td = &tif->tif_dir;
    uint64_t scanline;

    scanline =
        _TIFFMultiply64(tif, td->td_bitspersample, td->td_imagewidth, module);
    if (td->td_planarconfig == PLANARCONFIG_CONTIG)
    {
        scanline =
            _TIFFMultiply64(tif, scanline, td->td_samplesperpixel, module);
        return (TIFFhowmany8_64(scanline));
    }
    else
        return (_TIFFMultiply64(tif, TIFFhowmany8_64(scanline),
                                td->td_samplesperpixel, module));
}